

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtree.hpp
# Opt level: O2

void __thiscall
perior::
rtree<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_perior::quadratic<6UL,_2UL>,_perior::cubic_periodic_boundary<perior::point<double,_2UL>_>,_perior::indexable_getter<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::equal_to<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
::condense_leaf(rtree<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_perior::quadratic<6UL,_2UL>,_perior::cubic_periodic_boundary<perior::point<double,_2UL>_>,_perior::indexable_getter<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::equal_to<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
                *this,size_t N)

{
  tree_type *this_00;
  undefined1 *puVar1;
  ulong uVar2;
  pointer bg_1;
  reference prVar3;
  reference prVar4;
  reference puVar5;
  reference v;
  pointer bg;
  const_iterator i;
  iterator found;
  temporal_vec_type eliminated_objs;
  undefined1 local_90 [16];
  vec_iterator<unsigned_long_*,_false> local_80 [2];
  vector_alloc_holder<boost::container::small_vector_allocator<unsigned_long,_std::allocator<void>,_void>,_unsigned_long,_boost::move_detail::integral_constant<unsigned_int,_1U>_>
  local_70;
  undefined1 local_58 [16];
  undefined1 *local_48;
  double *local_40;
  vec_iterator<unsigned_long_*,_true> local_38;
  vec_iterator<unsigned_long_*,_true> local_30;
  
  this_00 = &this->tree_;
  local_80[1].m_ptr = (unsigned_long *)N;
  prVar3 = boost::container::
           vector<perior::detail::rtree_node<perior::point<double,_2UL>,_2UL,_6UL>,_std::allocator<perior::detail::rtree_node<perior::point<double,_2UL>,_2UL,_6UL>_>,_void>
           ::at(this_00,N);
  if (prVar3->is_leaf == false) {
    __assert_fail("node.is_leaf",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/ToruNiina[P]periortree/periortree/rtree.hpp"
                  ,0x151,
                  "void perior::rtree<std::pair<perior::rectangle<perior::point<double, 2>>, unsigned long>, perior::quadratic<6, 2>, perior::cubic_periodic_boundary<perior::point<double, 2>>>::condense_leaf(const std::size_t) [T = std::pair<perior::rectangle<perior::point<double, 2>>, unsigned long>, Params = perior::quadratic<6, 2>, Boundary = perior::cubic_periodic_boundary<perior::point<double, 2>>, IndexableGetter = perior::indexable_getter<std::pair<perior::rectangle<perior::point<double, 2>>, unsigned long>>, EqualTo = std::equal_to<std::pair<perior::rectangle<perior::point<double, 2>>, unsigned long>>, Allocator = std::allocator<std::pair<perior::rectangle<perior::point<double, 2>>, unsigned long>>]"
                 );
  }
  uVar2 = (prVar3->entry).
          super_vector<unsigned_long,_boost::container::dtl::static_storage_allocator<unsigned_long,_6UL,_0UL,_true>,_void>
          .m_holder.m_size;
  if ((uVar2 < 2) && (prVar3->parent != 0xffffffffffffffff)) {
    local_70.m_start = (pointer)local_58;
    local_70.m_size = 0;
    local_30.m_ptr = (unsigned_long *)&prVar3->entry;
    local_70.m_capacity = 2;
    local_38.m_ptr =
         (unsigned_long *)
         ((long)&(((container_type *)local_30.m_ptr)->
                 super_vector<unsigned_long,_boost::container::dtl::static_storage_allocator<unsigned_long,_6UL,_0UL,_true>,_void>
                 ).m_holder.super_static_storage_allocator<unsigned_long,_6UL,_0UL,_true>.storage +
         uVar2 * 8);
    std::
    copy<boost::container::vec_iterator<unsigned_long*,true>,std::back_insert_iterator<boost::container::small_vector<unsigned_long,2ul,std::allocator<unsigned_long>,void>>>
              (&local_30,&local_38,
               (small_vector<unsigned_long,_2UL,_std::allocator<unsigned_long>,_void> *)&local_70);
    prVar4 = boost::container::
             vector<perior::detail::rtree_node<perior::point<double,_2UL>,_2UL,_6UL>,_std::allocator<perior::detail::rtree_node<perior::point<double,_2UL>,_2UL,_6UL>_>,_void>
             ::at(this_00,prVar3->parent);
    local_80[0].m_ptr = (unsigned_long *)&prVar4->entry;
    prVar4 = boost::container::
             vector<perior::detail::rtree_node<perior::point<double,_2UL>,_2UL,_6UL>,_std::allocator<perior::detail::rtree_node<perior::point<double,_2UL>,_2UL,_6UL>_>,_void>
             ::at(this_00,prVar3->parent);
    local_40 = (prVar4->box).center.values_.elems +
               ((prVar4->entry).
                super_vector<unsigned_long,_boost::container::dtl::static_storage_allocator<unsigned_long,_6UL,_0UL,_true>,_void>
                .m_holder.m_size - 7);
    std::find<boost::container::vec_iterator<unsigned_long*,false>,unsigned_long>
              ((vec_iterator<unsigned_long_*,_false> *)(local_90 + 8),local_80,
               (unsigned_long *)&local_40);
    prVar4 = boost::container::
             vector<perior::detail::rtree_node<perior::point<double,_2UL>,_2UL,_6UL>,_std::allocator<perior::detail::rtree_node<perior::point<double,_2UL>,_2UL,_6UL>_>,_void>
             ::at(this_00,prVar3->parent);
    if ((double *)local_90._8_8_ ==
        (prVar4->box).center.values_.elems +
        ((prVar4->entry).
         super_vector<unsigned_long,_boost::container::dtl::static_storage_allocator<unsigned_long,_6UL,_0UL,_true>,_void>
         .m_holder.m_size - 7)) {
      __assert_fail("found != this->tree_.at(node.parent).entry.end()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/ToruNiina[P]periortree/periortree/rtree.hpp"
                    ,0x162,
                    "void perior::rtree<std::pair<perior::rectangle<perior::point<double, 2>>, unsigned long>, perior::quadratic<6, 2>, perior::cubic_periodic_boundary<perior::point<double, 2>>>::condense_leaf(const std::size_t) [T = std::pair<perior::rectangle<perior::point<double, 2>>, unsigned long>, Params = perior::quadratic<6, 2>, Boundary = perior::cubic_periodic_boundary<perior::point<double, 2>>, IndexableGetter = perior::indexable_getter<std::pair<perior::rectangle<perior::point<double, 2>>, unsigned long>>, EqualTo = std::equal_to<std::pair<perior::rectangle<perior::point<double, 2>>, unsigned long>>, Allocator = std::allocator<std::pair<perior::rectangle<perior::point<double, 2>>, unsigned long>>]"
                   );
    }
    prVar4 = boost::container::
             vector<perior::detail::rtree_node<perior::point<double,_2UL>,_2UL,_6UL>,_std::allocator<perior::detail::rtree_node<perior::point<double,_2UL>,_2UL,_6UL>_>,_void>
             ::at(this_00,prVar3->parent);
    local_48 = (undefined1 *)local_90._8_8_;
    boost::container::
    vector<unsigned_long,_boost::container::dtl::static_storage_allocator<unsigned_long,_6UL,_0UL,_true>,_void>
    ::erase((vector<unsigned_long,_boost::container::dtl::static_storage_allocator<unsigned_long,_6UL,_0UL,_true>,_void>
             *)local_90,(const_iterator *)&prVar4->entry);
    prVar4 = boost::container::
             vector<perior::detail::rtree_node<perior::point<double,_2UL>,_2UL,_6UL>,_std::allocator<perior::detail::rtree_node<perior::point<double,_2UL>,_2UL,_6UL>_>,_void>
             ::at(this_00,prVar3->parent);
    condense_box(this,prVar4);
    local_90._0_8_ = local_70.m_start;
    puVar1 = (undefined1 *)((long)local_70.m_start + local_70.m_size * 8);
    while ((undefined1 *)local_90._0_8_ != puVar1) {
      puVar5 = boost::container::vec_iterator<unsigned_long_*,_true>::operator*
                         ((vec_iterator<unsigned_long_*,_true> *)local_90);
      v = boost::container::
          vector<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_void>
          ::at(&this->container_,*puVar5);
      insert(this,v);
      boost::container::vec_iterator<unsigned_long_*,_true>::operator++
                ((vec_iterator<unsigned_long_*,_true> *)local_90);
    }
    condense_node(this,prVar3->parent);
    boost::container::
    vector_alloc_holder<boost::container::small_vector_allocator<unsigned_long,_std::allocator<void>,_void>,_unsigned_long,_boost::move_detail::integral_constant<unsigned_int,_1U>_>
    ::~vector_alloc_holder(&local_70);
  }
  return;
}

Assistant:

void condense_leaf(const std::size_t N)
    {
        const node_type& node = this->tree_.at(N);
        assert(node.is_leaf);

        if(node.has_enough_entry() || node.parent == nil)
        {
            return;
        }

        // copy index of objects
        typedef typename gen_small_vector<std::size_t, min_entry>::type temporal_vec_type;
        temporal_vec_type eliminated_objs;
        std::copy(node.entry.begin(), node.entry.end(),
                  std::back_inserter(eliminated_objs));

        // erase the node N from its parent and condense aabb
        typename node_type::iterator found = std::find(
                this->tree_.at(node.parent).entry.begin(),
                this->tree_.at(node.parent).entry.end(), N);
        assert(found != this->tree_.at(node.parent).entry.end());
        this->tree_.at(node.parent).entry.erase(found);
        this->condense_box(this->tree_.at(node.parent));

        // re-insert entries eliminated from node N
        for(typename temporal_vec_type::const_iterator
                i(eliminated_objs.begin()), e(eliminated_objs.end()); i!=e; ++i)
        {
            this->insert(this->container_.at(*i));
        }

        // condense ancester nodes...
        condense_node(node.parent);
        return;
    }